

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SavepointUnittest.cpp
# Opt level: O2

void __thiscall
SavepointUnittest_Basic_Test::~SavepointUnittest_Basic_Test(SavepointUnittest_Basic_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(SavepointUnittest, Basic)
{
    Savepoint& sp = *reinterpret_cast<Savepoint*>(fs_create_savepoint("MySavepoint", 11));

    ASSERT_EQ("MySavepoint", sp.name());

    // Add some metainfo with the C++ API
    sp.AddMetainfo("StepNumber", 42);
    sp.AddMetainfo("TimeStepSize", 0.125);
    sp.AddMetainfo("SavepointAuthor", "Andrea Arteaga");

    // Add some metainfo with the C API
    fs_add_savepoint_metainfo_b(&sp, "ILikeThisAPI", 12, true);
    fs_add_savepoint_metainfo_d(&sp, "HowManyCookiesIEat", 18, 7.5);
    fs_add_savepoint_metainfo_s(&sp, "MyOS", 4, "GNU/Linux", 9);

    // Check metainfo
    ASSERT_EQ(6, sp.metainfo().size());
    ASSERT_EQ(42, sp.metainfo().AsInt("StepNumber"));
    ASSERT_EQ(0.125, sp.metainfo().AsDouble("TimeStepSize"));
    ASSERT_EQ(std::string("Andrea Arteaga"), sp.metainfo().AsString("SavepointAuthor"));
    ASSERT_EQ(true, sp.metainfo().AsBool("ILikeThisAPI"));
    ASSERT_EQ(7.5, sp.metainfo().AsDouble("HowManyCookiesIEat"));
    ASSERT_EQ(std::string("GNU/Linux"), sp.metainfo().AsString("MyOS"));

    fs_destroy_savepoint(&sp);
}